

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetClean(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmGeneratedFileStream *os_00;
  allocator<char> local_1af;
  allocator<char> local_1ae;
  allocator<char> local_1ad;
  allocator<char> local_1ac;
  allocator<char> local_1ab;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  cmNinjaDeps local_1a8;
  ostream *local_190;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  
  os_00 = this->RulesFileStream;
  local_190 = os;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"CLEAN",(allocator<char> *)&local_1a8);
  ninjaCmd_abi_cxx11_(&local_148,this);
  std::operator+(&local_128,&local_148," -t clean");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Cleaning all built files...",&local_1ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"Rule for cleaning all built files.",&local_1ad);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_1ae);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_1af);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_1a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_1aa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_1ab);
  WriteRule((ostream *)os_00,(string *)local_68,&local_128,&local_168,&local_188,&local_a8,&local_c8
            ,&local_88,&local_e8,&local_108,false);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Clean all the built files.",&local_1ac);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"CLEAN",&local_1ad);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"clean",&local_1ae);
  NinjaOutputPath(&local_168,this,&local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_c8,1,&local_168,(allocator_type *)&local_1af);
  local_88.field_2._M_allocated_capacity = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_108.field_2._M_allocated_capacity = 0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  local_68._24_8_ = local_68 + 8;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_40 = 0;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_48 = (_Base_ptr)local_68._24_8_;
  WriteBuild(this,local_190,&local_128,&local_148,(cmNinjaDeps *)&local_c8,(cmNinjaDeps *)&local_88,
             (cmNinjaDeps *)&local_e8,(cmNinjaDeps *)&local_108,&local_1a8,(cmNinjaVars *)local_68,
             &local_a8,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetClean(std::ostream& os)
{
  WriteRule(*this->RulesFileStream, "CLEAN", ninjaCmd() + " -t clean",
            "Cleaning all built files...",
            "Rule for cleaning all built files.",
            /*depfile=*/"",
            /*deptype=*/"",
            /*rspfile=*/"",
            /*rspcontent*/ "",
            /*restat=*/"",
            /*generator=*/false);
  WriteBuild(os, "Clean all the built files.", "CLEAN",
             /*outputs=*/cmNinjaDeps(1, this->NinjaOutputPath("clean")),
             /*implicitOuts=*/cmNinjaDeps(),
             /*explicitDeps=*/cmNinjaDeps(),
             /*implicitDeps=*/cmNinjaDeps(),
             /*orderOnlyDeps=*/cmNinjaDeps(),
             /*variables=*/cmNinjaVars());
}